

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_log_messages.cpp
# Opt level: O2

void HandleMessageCallback(Message *message,void *userData)

{
  hrgls_MessageLevel hVar1;
  ostream *poVar2;
  string sStack_38;
  
  *(long *)userData = *userData + 1;
  poVar2 = std::operator<<((ostream *)&std::cout,"Callback message with level ");
  hVar1 = hrgls::Message::Level(message);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,hVar1);
  poVar2 = std::operator<<(poVar2," received: ");
  hrgls::Message::Value_abi_cxx11_(&sStack_38,message);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void HandleMessageCallback(hrgls::Message &message, void *userData)
{
  // Increment to keep track of how many messages arrived.
  size_t *count = static_cast<size_t*>(userData);
  (*count)++;

  // Print the message
  std::cout << "Callback message with level " << message.Level()
    << " received: " << message.Value() << std::endl;
}